

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclaredType.cpp
# Opt level: O0

ASTContext * __thiscall
slang::ast::DeclaredType::getASTContext<true,slang::ast::ASTContext>(DeclaredType *this)

{
  LookupLocation lookupLocation;
  bool bVar1;
  undefined1 uVar2;
  Symbol *pSVar3;
  Scope *pSVar4;
  undefined8 *in_RSI;
  ASTContext *in_RDI;
  LookupLocation LVar5;
  LookupLocation location;
  InstanceSymbol *inst;
  InstanceBodySymbol *instBody;
  Scope *scope;
  bitmask<slang::ast::ASTFlags> astFlags;
  bitmask<slang::ast::DeclaredTypeFlags> *in_stack_fffffffffffffe48;
  Symbol *in_stack_fffffffffffffe50;
  ASTContext *in_stack_fffffffffffffe58;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffffe60;
  bitmask<slang::ast::ASTFlags> flags;
  undefined8 *puVar6;
  undefined7 in_stack_fffffffffffffe70;
  bitmask<slang::ast::DeclaredTypeFlags> local_ec;
  LookupLocation local_e8;
  LookupLocation local_d8;
  underlying_type local_c8;
  Scope *local_c0;
  uint32_t local_b8;
  Scope *local_b0;
  uint32_t local_a8;
  bitmask<slang::ast::ASTFlags> local_a0;
  bitmask<slang::ast::InstanceFlags> local_91;
  InstanceSymbol *local_90;
  InstanceBodySymbol *local_88;
  bitmask<slang::ast::DeclaredTypeFlags> local_7c;
  bitmask<slang::ast::ASTFlags> local_78;
  bitmask<slang::ast::ASTFlags> local_70;
  Scope *local_68;
  bitmask<slang::ast::ASTFlags> local_60;
  bitmask<slang::ast::DeclaredTypeFlags> local_54;
  bitmask<slang::ast::ASTFlags> local_50;
  bitmask<slang::ast::DeclaredTypeFlags> local_44;
  bitmask<slang::ast::ASTFlags> local_40;
  bitmask<slang::ast::DeclaredTypeFlags> local_34;
  bitmask<slang::ast::ASTFlags> local_30;
  bitmask<slang::ast::DeclaredTypeFlags> local_24;
  bitmask<slang::ast::ASTFlags> local_20;
  bitmask<slang::ast::DeclaredTypeFlags> local_14;
  bitmask<slang::ast::ASTFlags> local_10 [2];
  
  bitmask<slang::ast::ASTFlags>::bitmask(local_10);
  bitmask<slang::ast::DeclaredTypeFlags>::bitmask(&local_14,NetType);
  bVar1 = bitmask<slang::ast::DeclaredTypeFlags>::has
                    ((bitmask<slang::ast::DeclaredTypeFlags> *)in_stack_fffffffffffffe50,
                     in_stack_fffffffffffffe48);
  if (bVar1) {
    bitmask<slang::ast::ASTFlags>::bitmask(&local_20,NonProcedural);
    bitmask<slang::ast::ASTFlags>::operator|=(local_10,&local_20);
  }
  bitmask<slang::ast::DeclaredTypeFlags>::bitmask(&local_24,AutomaticInitializer);
  bVar1 = bitmask<slang::ast::DeclaredTypeFlags>::has
                    ((bitmask<slang::ast::DeclaredTypeFlags> *)in_stack_fffffffffffffe50,
                     in_stack_fffffffffffffe48);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    bitmask<slang::ast::ASTFlags>::bitmask(&local_30,StaticInitializer);
    bitmask<slang::ast::ASTFlags>::operator|=(local_10,&local_30);
  }
  bitmask<slang::ast::DeclaredTypeFlags>::bitmask(&local_34,CoverageType);
  bVar1 = bitmask<slang::ast::DeclaredTypeFlags>::has
                    ((bitmask<slang::ast::DeclaredTypeFlags> *)in_stack_fffffffffffffe50,
                     in_stack_fffffffffffffe48);
  if (bVar1) {
    bitmask<slang::ast::ASTFlags>::bitmask(&local_40,AllowCoverageSampleFormal);
    bitmask<slang::ast::ASTFlags>::operator|=(local_10,&local_40);
  }
  bitmask<slang::ast::DeclaredTypeFlags>::bitmask(&local_44,UserDefinedNetType);
  bVar1 = bitmask<slang::ast::DeclaredTypeFlags>::has
                    ((bitmask<slang::ast::DeclaredTypeFlags> *)in_stack_fffffffffffffe50,
                     in_stack_fffffffffffffe48);
  if (bVar1) {
    bitmask<slang::ast::ASTFlags>::bitmask(&local_50,AllowNetType);
    bitmask<slang::ast::ASTFlags>::operator|=(local_10,&local_50);
  }
  bitmask<slang::ast::DeclaredTypeFlags>::bitmask(&local_54,DPIArg);
  bVar1 = bitmask<slang::ast::DeclaredTypeFlags>::has
                    ((bitmask<slang::ast::DeclaredTypeFlags> *)in_stack_fffffffffffffe50,
                     in_stack_fffffffffffffe48);
  if (bVar1) {
    bitmask<slang::ast::ASTFlags>::bitmask(&local_60,DPIArg);
    bitmask<slang::ast::ASTFlags>::operator|=(local_10,&local_60);
  }
  local_68 = Symbol::getParentScope((Symbol *)*in_RSI);
  if (*(int *)*in_RSI == 0x4a) {
    bitmask<slang::ast::ASTFlags>::bitmask(&local_70,SpecparamInitializer);
    bitmask<slang::ast::ASTFlags>::operator|=(local_10,&local_70);
    pSVar3 = Scope::asSymbol(local_68);
    if (pSVar3->kind == SpecifyBlock) {
      bitmask<slang::ast::ASTFlags>::bitmask(&local_78,SpecifyBlock);
      bitmask<slang::ast::ASTFlags>::operator|=(local_10,&local_78);
    }
  }
  puVar6 = in_RSI + 7;
  bitmask<slang::ast::DeclaredTypeFlags>::bitmask(&local_7c,InitializerOverridden);
  uVar2 = bitmask<slang::ast::DeclaredTypeFlags>::has
                    ((bitmask<slang::ast::DeclaredTypeFlags> *)in_stack_fffffffffffffe50,
                     in_stack_fffffffffffffe48);
  if ((bool)uVar2) {
    Scope::asSymbol(local_68);
    local_88 = Symbol::as<slang::ast::InstanceBodySymbol>((Symbol *)0x9fd08e);
    local_90 = local_88->parentInstance;
    local_68 = Symbol::getParentScope((Symbol *)local_90);
    flags.m_bits = (underlying_type)&local_88->flags;
    bitmask<slang::ast::InstanceFlags>::bitmask(&local_91,FromBind);
    bVar1 = bitmask<slang::ast::InstanceFlags>::has
                      ((bitmask<slang::ast::InstanceFlags> *)in_stack_fffffffffffffe50,
                       (bitmask<slang::ast::InstanceFlags> *)in_stack_fffffffffffffe48);
    if (bVar1) {
      bitmask<slang::ast::ASTFlags>::bitmask(&local_a0,BindInstantiation);
      bitmask<slang::ast::ASTFlags>::operator|=(local_10,&local_a0);
    }
    pSVar4 = local_68;
    LVar5 = LookupLocation::before(in_stack_fffffffffffffe50);
    local_c0 = LVar5.scope;
    local_b8 = LVar5.index;
    local_c8 = local_10[0].m_bits;
    LVar5._8_7_ = in_stack_fffffffffffffe70;
    LVar5.scope = (Scope *)puVar6;
    LVar5._15_1_ = uVar2;
    local_b0 = local_c0;
    local_a8 = local_b8;
    ASTContext::ASTContext((ASTContext *)pSVar4,(Scope *)in_stack_fffffffffffffe50,LVar5,flags);
  }
  else {
    LookupLocation::LookupLocation(&local_d8);
    if ((*(uint *)((long)in_RSI + 0x3c) & 0x3fffffff) == 0) {
      in_stack_fffffffffffffe50 = (Symbol *)(in_RSI + 7);
      bitmask<slang::ast::DeclaredTypeFlags>::bitmask(&local_ec,InitializerCantSeeParent);
      bVar1 = bitmask<slang::ast::DeclaredTypeFlags>::has
                        ((bitmask<slang::ast::DeclaredTypeFlags> *)in_stack_fffffffffffffe50,
                         in_stack_fffffffffffffe48);
      if (bVar1) {
        LVar5 = LookupLocation::before(in_stack_fffffffffffffe50);
        local_d8.scope = LVar5.scope;
        local_d8.index = LVar5.index;
      }
      else {
        LVar5 = LookupLocation::after(in_stack_fffffffffffffe50);
        local_d8.scope = LVar5.scope;
        local_d8.index = LVar5.index;
      }
    }
    else {
      pSVar4 = Symbol::getParentScope((Symbol *)*in_RSI);
      LookupLocation::LookupLocation(&local_e8,pSVar4,*(uint *)((long)in_RSI + 0x3c) & 0x3fffffff);
      local_d8.scope = local_e8.scope;
      local_d8.index = local_e8.index;
    }
    lookupLocation._8_7_ = in_stack_fffffffffffffe70;
    lookupLocation.scope = (Scope *)puVar6;
    lookupLocation._15_1_ = uVar2;
    ASTContext::ASTContext
              (in_stack_fffffffffffffe58,(Scope *)in_stack_fffffffffffffe50,lookupLocation,
               in_stack_fffffffffffffe60);
  }
  return in_RDI;
}

Assistant:

T DeclaredType::getASTContext() const {
    bitmask<ASTFlags> astFlags;
    if (flags.has(DeclaredTypeFlags::NetType))
        astFlags |= ASTFlags::NonProcedural;
    if (!flags.has(DeclaredTypeFlags::AutomaticInitializer))
        astFlags |= ASTFlags::StaticInitializer;
    if (flags.has(DeclaredTypeFlags::CoverageType))
        astFlags |= ASTFlags::AllowCoverageSampleFormal;
    if (flags.has(DeclaredTypeFlags::UserDefinedNetType))
        astFlags |= ASTFlags::AllowNetType;
    if (flags.has(DeclaredTypeFlags::DPIArg))
        astFlags |= ASTFlags::DPIArg;

    const Scope* scope = parent.getParentScope();
    SLANG_ASSERT(scope);

    // Specparams inside of specify blocks have additional constraints so we
    // need to set the AST flag for them.
    if (parent.kind == SymbolKind::Specparam) {
        astFlags |= ASTFlags::SpecparamInitializer;
        if (scope->asSymbol().kind == SymbolKind::SpecifyBlock)
            astFlags |= ASTFlags::SpecifyBlock;
    }

    // If this type/initializer has been overridden by a parameter override,
    // we should use the instantiation scope and not the parameter's scope
    // when resolving.
    if ((IsInitializer && flags.has(DeclaredTypeFlags::InitializerOverridden)) ||
        (!IsInitializer && flags.has(DeclaredTypeFlags::TypeOverridden))) {
        auto& instBody = scope->asSymbol().as<InstanceBodySymbol>();
        auto inst = instBody.parentInstance;
        SLANG_ASSERT(inst);

        scope = inst->getParentScope();
        SLANG_ASSERT(scope);

        if (instBody.flags.has(InstanceFlags::FromBind))
            astFlags |= ASTFlags::BindInstantiation;

        return ASTContext(*scope, LookupLocation::before(*inst), astFlags);
    }

    // The location depends on whether we are creating the initializer or the type.
    // Initializer lookup happens *after* the parent symbol, so that it can reference
    // the symbol itself. Type lookup happens *before*, since it can't yet see the
    // symbol declaration. There is an exception for parameters, which also can't
    // see its own declaration (which would result in infinite recursion).
    LookupLocation location;
    if (overrideIndex) {
        location = LookupLocation(parent.getParentScope(), overrideIndex);
    }
    else if (IsInitializer) {
        if (flags.has(DeclaredTypeFlags::InitializerCantSeeParent))
            location = LookupLocation::before(parent);
        else
            location = LookupLocation::after(parent);
    }
    else {
        location = LookupLocation::before(parent);
    }

    return ASTContext(*scope, location, astFlags);
}